

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O2

void aec_get_rsi_msb_32(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = strm->state->data_raw;
  uVar3 = strm->block_size * strm->rsi;
  puVar2 = strm->next_in;
  strm->next_in = puVar2 + (int)(uVar3 * 4);
  strm->avail_in = strm->avail_in - (long)(int)(uVar3 * 4);
  uVar5 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = *(uint *)(puVar2 + uVar5 * 4);
    puVar1[uVar5] = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  return;
}

Assistant:

void aec_get_rsi_msb_32(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    strm->next_in += 4 * rsi;
    strm->avail_in -= 4 * rsi;

    for (int i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[4 * i] << 24)
            | ((uint32_t)in[4 * i + 1] << 16)
            | ((uint32_t)in[4 * i + 2] << 8)
            | (uint32_t)in[4 * i + 3];
}